

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O0

void __thiscall MeCab::FreeList<mecab_path_t>::~FreeList(FreeList<mecab_path_t> *this)

{
  pointer ppmVar1;
  pointer ppmVar2;
  reference ppmVar3;
  vector<mecab_path_t_*,_std::allocator<mecab_path_t_*>_> *in_RDI;
  
  (in_RDI->super__Vector_base<mecab_path_t_*,_std::allocator<mecab_path_t_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__FreeList_001c6a20;
  in_RDI[1].super__Vector_base<mecab_path_t_*,_std::allocator<mecab_path_t_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    ppmVar1 = in_RDI[1].super__Vector_base<mecab_path_t_*,_std::allocator<mecab_path_t_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    ppmVar2 = (pointer)std::vector<mecab_path_t_*,_std::allocator<mecab_path_t_*>_>::size
                                 ((vector<mecab_path_t_*,_std::allocator<mecab_path_t_*>_> *)
                                  &(in_RDI->
                                   super__Vector_base<mecab_path_t_*,_std::allocator<mecab_path_t_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish);
    if (ppmVar2 <= ppmVar1) break;
    ppmVar3 = std::vector<mecab_path_t_*,_std::allocator<mecab_path_t_*>_>::operator[]
                        ((vector<mecab_path_t_*,_std::allocator<mecab_path_t_*>_> *)
                         &(in_RDI->
                          super__Vector_base<mecab_path_t_*,_std::allocator<mecab_path_t_*>_>).
                          _M_impl.super__Vector_impl_data._M_finish,
                         (size_type)
                         in_RDI[1].
                         super__Vector_base<mecab_path_t_*,_std::allocator<mecab_path_t_*>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage);
    if (*ppmVar3 != (value_type)0x0) {
      operator_delete__(*ppmVar3);
    }
    in_RDI[1].super__Vector_base<mecab_path_t_*,_std::allocator<mecab_path_t_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)in_RDI[1].
                         super__Vector_base<mecab_path_t_*,_std::allocator<mecab_path_t_*>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage + 1);
  }
  std::vector<mecab_path_t_*,_std::allocator<mecab_path_t_*>_>::~vector(in_RDI);
  return;
}

Assistant:

virtual ~FreeList() {
    for (li_ = 0; li_ < freeList.size(); li_++)
      delete [] freeList[li_];
  }